

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

void __thiscall cmDepends::cmDepends(cmDepends *this,cmLocalGenerator *lg,string *targetDir)

{
  char *pcVar1;
  string *targetDir_local;
  cmLocalGenerator *lg_local;
  cmDepends *this_local;
  
  this->_vptr_cmDepends = (_func_int **)&PTR__cmDepends_009b4b38;
  this->LocalGenerator = lg;
  this->Verbose = false;
  this->FileTimeCache = (cmFileTimeCache *)0x0;
  std::__cxx11::string::string((string *)&this->Language);
  std::__cxx11::string::string((string *)&this->TargetDirectory,(string *)targetDir);
  this->MaxPath = 0x4000;
  pcVar1 = (char *)operator_new__(this->MaxPath);
  this->Dependee = pcVar1;
  pcVar1 = (char *)operator_new__(this->MaxPath);
  this->Depender = pcVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->IncludePath);
  return;
}

Assistant:

cmDepends::cmDepends(cmLocalGenerator* lg, std::string targetDir)
  : LocalGenerator(lg)
  , TargetDirectory(std::move(targetDir))
  , Dependee(new char[MaxPath])
  , Depender(new char[MaxPath])
{
}